

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall SuiteSessionTests::TestCallback::TestCallback(TestCallback *this)

{
  undefined4 uVar1;
  DateTime d;
  undefined8 local_30;
  int64_t iStack_28;
  
  (this->super_Responder)._vptr_Responder = (_func_int **)&PTR__TestCallback_00326530;
  (this->super_NullApplication).super_Application._vptr_Application =
       (_func_int **)&PTR__TestCallback_00326580;
  (this->startTime).super_DateTime.m_date = 0;
  (this->startTime).super_DateTime.m_time = 0;
  (this->startTime).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_003248b8;
  FIX::DateTime::nowUtc();
  (this->startTime).super_DateTime.m_time = iStack_28;
  uVar1 = *(undefined4 *)&(this->startTime).super_DateTime.field_0xc;
  (this->endTime).super_DateTime.m_date = (this->startTime).super_DateTime.m_date;
  *(undefined4 *)&(this->endTime).super_DateTime.field_0xc = uVar1;
  (this->endTime).super_DateTime.m_time = (this->startTime).super_DateTime.m_time;
  (this->endTime).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_003248b8;
  FIX::DateTime::nowUtc();
  *(undefined8 *)&(this->startTimeStamp).super_DateTime.m_date = local_30;
  (this->startTimeStamp).super_DateTime.m_time = iStack_28;
  (this->startTimeStamp).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_00324850;
  FIX::DateTime::nowUtc();
  *(undefined8 *)&(this->endTimeStamp).super_DateTime.m_date = local_30;
  (this->endTimeStamp).super_DateTime.m_time = iStack_28;
  (this->endTimeStamp).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_00324850;
  FIX::Message::Message(&this->lastResent);
  FIX::Message::Message(&this->sentLogon);
  FIX::Message::Message(&this->sentResendRequest);
  FIX::Message::Message(&this->sentHeartbeat);
  this->fromSequenceReset = 0;
  this->resent = 0;
  this->disconnected = 0;
  this->checkForDoNotSend = 0;
  this->fromTestRequest = 0;
  this->fromLogout = 0;
  this->fromReject = 0;
  this->fromSequenceReset = 0;
  this->toReject = 0;
  this->toSequenceReset = 0;
  this->toBusinessMessageReject = 0;
  this->fromHeartbeat = 0;
  this->toLogon = 0;
  this->toResendRequest = 0;
  this->toHeartbeat = 0;
  this->toLogout = 0;
  *(code **)&this->factory = FIX::SocketServer::accept;
  return;
}

Assistant:

TestCallback()
  : endTime( startTime ),
    toLogon( 0 ),
    toResendRequest( 0 ),
    toHeartbeat( 0 ),
    toLogout( 0 ),
    toReject( 0 ),
    toSequenceReset( 0 ),
    toBusinessMessageReject( 0 ),
    fromHeartbeat( 0 ),
    fromTestRequest( 0 ),
    fromLogout( 0 ),
    fromReject( 0 ),
    fromSequenceReset( 0 ),
    resent( 0 ),
    disconnected( 0 )
    {}